

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGen::RccLister::list
          (RccLister *this,string *qrcFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error,bool verbose)

{
  uint uVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  string *entry;
  pointer in_path;
  value_type *line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line_00;
  string *this_00;
  _Alloc_hider s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdOut;
  string rccStdErr;
  int retVal;
  uint uStack_3ec;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  string fileDir;
  string oline;
  string msg;
  uint auStack_218 [122];
  
  error->_M_string_length = 0;
  *(error->_M_dataplus)._M_p = '\0';
  bVar3 = cmsys::SystemTools::FileExists(qrcFile,true);
  if (!bVar3) {
    std::__cxx11::string::assign((char *)error);
    Quoted(&msg,qrcFile);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::append((char *)error);
    return false;
  }
  cmsys::SystemTools::GetFilenamePath(&fileDir,qrcFile);
  if ((((this->RccExcutable_)._M_string_length == 0) ||
      (bVar3 = cmsys::SystemTools::FileExists(&this->RccExcutable_,true), !bVar3)) ||
     ((this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    _retVal = (pointer)&local_3e0;
    local_3e8 = 0;
    local_3e0._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&msg,(qrcFile->_M_dataplus)._M_p,_S_in);
    uVar1 = *(uint *)((long)auStack_218 + *(long *)(msg._M_dataplus._M_p + -0x18));
    if ((uVar1 & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oline);
      std::ostream::operator<<(&oline,(streambuf *)msg.field_2._M_local_buf);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&retVal,(string *)&cmd);
      std::__cxx11::string::~string((string *)&cmd);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oline);
    }
    else {
      std::__cxx11::string::assign((char *)error);
      Quoted(&oline,qrcFile);
      std::__cxx11::string::append((string *)error);
      std::__cxx11::string::~string((string *)&oline);
      std::__cxx11::string::append((char *)error);
    }
    std::ifstream::~ifstream(&msg);
    if ((uVar1 & 5) == 0) {
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&msg,"(<file[^<]+)");
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&oline,"(^<file[^>]*>)");
      s._M_p = _retVal;
      while (bVar3 = cmsys::RegularExpression::find((RegularExpression *)&msg,s._M_p), bVar3) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)&cmd,(RegularExpressionMatch *)&msg,1);
        s._M_p = s._M_p + (long)cmd.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
        cmsys::RegularExpression::find
                  ((RegularExpression *)&oline,
                   (char *)cmd.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&rccStdOut,(RegularExpressionMatch *)&oline,1);
        std::__cxx11::string::substr((ulong)&rccStdErr,(ulong)&cmd);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                   &rccStdErr);
        std::__cxx11::string::~string((string *)&rccStdErr);
        std::__cxx11::string::~string((string *)&rccStdOut);
        std::__cxx11::string::~string((string *)&cmd);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&oline);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&msg);
      std::__cxx11::string::~string((string *)&retVal);
LAB_00325a74:
      pbVar2 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (in_path = (files->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; in_path != pbVar2;
          in_path = in_path + 1) {
        cmsys::SystemTools::CollapseFullPath(&msg,in_path,&fileDir);
        std::__cxx11::string::operator=((string *)in_path,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
      bVar3 = true;
      goto LAB_00325abe;
    }
    this_00 = (string *)&retVal;
LAB_0032597e:
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    _retVal = (pointer)((ulong)uStack_3ec << 0x20);
    rccStdOut._M_dataplus._M_p = (pointer)&rccStdOut.field_2;
    rccStdOut._M_string_length = 0;
    rccStdErr._M_dataplus._M_p = (pointer)&rccStdErr.field_2;
    rccStdErr._M_string_length = 0;
    rccStdOut.field_2._M_local_buf[0] = '\0';
    rccStdErr.field_2._M_local_buf[0] = '\0';
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmd.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmd,
               &this->RccExcutable_);
    cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&cmd,&this->ListOptions_);
    cmsys::SystemTools::GetFilenameName(&msg,qrcFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmd,&msg);
    std::__cxx11::string::~string((string *)&msg);
    if (verbose) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"Running command:\n",(allocator<char> *)&oline);
      QuotedCommand(&oline,&cmd);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&oline);
      std::__cxx11::string::push_back((char)&msg);
      cmSystemTools::Stdout(&msg);
      std::__cxx11::string::~string((string *)&msg);
    }
    bVar3 = cmSystemTools::RunSingleCommand
                      (&cmd,&rccStdOut,&rccStdErr,&retVal,fileDir._M_dataplus._M_p,OUTPUT_NONE,
                       (cmDuration)0x0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmd);
    if (!bVar3 || retVal != 0) {
      std::__cxx11::string::assign((char *)error);
      Quoted(&msg,qrcFile);
      std::__cxx11::string::append((string *)error);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::append((char *)error);
      if (rccStdOut._M_string_length != 0) {
        std::__cxx11::string::append((string *)error);
        std::__cxx11::string::append((char *)error);
      }
      if (rccStdErr._M_string_length != 0) {
        std::__cxx11::string::append((string *)error);
        std::__cxx11::string::append((char *)error);
      }
      std::__cxx11::string::~string((string *)&rccStdErr);
      this_00 = &rccStdOut;
      goto LAB_0032597e;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&msg,(string *)&rccStdOut,_S_in);
    oline._M_string_length = 0;
    oline.field_2._M_local_buf[0] = '\0';
    oline._M_dataplus._M_p = (pointer)&oline.field_2;
    while (line = &oline,
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&msg,(string *)&oline),
          ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      RccListParseOutput::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&oline,line);
      if (oline._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(files,&oline);
      }
    }
    std::__cxx11::string::~string((string *)&oline);
    std::__cxx11::istringstream::~istringstream((istringstream *)&msg);
    std::__cxx11::istringstream::istringstream((istringstream *)&msg,(string *)&rccStdErr,_S_in);
    oline._M_string_length = 0;
    oline.field_2._M_local_buf[0] = '\0';
    oline._M_dataplus._M_p = (pointer)&oline.field_2;
    while( true ) {
      line_00 = &oline;
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&msg,(string *)&oline);
      uVar1 = *(uint *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18) + 0x20);
      if ((uVar1 & 5) != 0) break;
      RccListParseOutput::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&oline,line_00);
      bVar3 = cmHasLiteralPrefix<std::__cxx11::string,14ul>(&oline,(char (*) [14])"RCC: Error in");
      if (bVar3) {
        if ((RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
             ::searchString_abi_cxx11_ == '\0') &&
           (iVar4 = __cxa_guard_acquire(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                         ::searchString_abi_cxx11_), iVar4 != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                     ::searchString_abi_cxx11_,"Cannot find file \'",(allocator<char> *)&cmd);
          __cxa_atexit(std::__cxx11::string::~string,
                       RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                       ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                               ::searchString_abi_cxx11_);
        }
        lVar6 = std::__cxx11::string::find((string *)&oline,0x5e20e8);
        if (lVar6 == -1) {
          std::__cxx11::string::assign((char *)error);
          Quoted((string *)&cmd,&oline);
          std::__cxx11::string::append((string *)error);
          std::__cxx11::string::~string((string *)&cmd);
          std::__cxx11::string::append((char *)error);
          break;
        }
        std::__cxx11::string::substr((ulong)&cmd,(ulong)&oline);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmd);
        std::__cxx11::string::~string((string *)&cmd);
      }
    }
    std::__cxx11::string::~string((string *)&oline);
    std::__cxx11::istringstream::~istringstream((istringstream *)&msg);
    std::__cxx11::string::~string((string *)&rccStdErr);
    std::__cxx11::string::~string((string *)&rccStdOut);
    if ((uVar1 & 5) != 0) goto LAB_00325a74;
  }
  bVar3 = false;
LAB_00325abe:
  std::__cxx11::string::~string((string *)&fileDir);
  return bVar3;
}

Assistant:

bool cmQtAutoGen::RccLister::list(std::string const& qrcFile,
                                  std::vector<std::string>& files,
                                  std::string& error, bool verbose) const
{
  error.clear();

  if (!cmSystemTools::FileExists(qrcFile, true)) {
    error = "The resource file ";
    error += Quoted(qrcFile);
    error += " does not exist.";
    return false;
  }

  // Run rcc list command in the directory of the qrc file with the pathless
  // qrc file name argument.  This way rcc prints relative paths.
  // This avoids issues on Windows when the qrc file is in a path that
  // contains non-ASCII characters.
  std::string const fileDir = cmSystemTools::GetFilenamePath(qrcFile);

  if (!this->RccExcutable_.empty() &&
      cmSystemTools::FileExists(this->RccExcutable_, true) &&
      !this->ListOptions_.empty()) {

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.emplace_back(this->RccExcutable_);
      cmAppend(cmd, this->ListOptions_);
      cmd.emplace_back(cmSystemTools::GetFilenameName(qrcFile));

      // Log command
      if (verbose) {
        std::string msg = "Running command:\n";
        msg += QuotedCommand(cmd);
        msg += '\n';
        cmSystemTools::Stdout(msg);
      }

      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error = "The rcc list process failed for ";
      error += Quoted(qrcFile);
      error += "\n";
      if (!rccStdOut.empty()) {
        error += rccStdOut;
        error += "\n";
      }
      if (!rccStdErr.empty()) {
        error += rccStdErr;
        error += "\n";
      }
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(qrcFile.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = "The resource file ";
          error += Quoted(qrcFile);
          error += " is not readable\n";
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  for (std::string& entry : files) {
    entry = cmSystemTools::CollapseFullPath(entry, fileDir);
  }
  return true;
}